

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ct.cpp
# Opt level: O1

void UConverter_toUnicode_CompoundText_OFFSETS(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  char cVar1;
  byte *pbVar2;
  void *pvVar3;
  UChar *pUVar4;
  UConverter *pUVar5;
  UConverterSharedData *pUVar6;
  uint uVar7;
  size_t sVar8;
  uint uVar9;
  uint8_t *puVar10;
  long lVar11;
  ulong uVar12;
  int32_t offset;
  long lVar13;
  uint8_t *puVar14;
  long lVar15;
  byte bVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  UChar *pUVar20;
  UConverterToUnicodeArgs subArgs;
  UConverterToUnicodeArgs local_68;
  
  puVar14 = (uint8_t *)args->source;
  pUVar20 = args->target;
  pbVar2 = (byte *)args->sourceLimit;
  pvVar3 = args->converter->extraInfo;
  uVar7._0_2_ = args->size;
  uVar7._2_1_ = args->flush;
  uVar7._3_1_ = args->field_0x3;
  uVar9 = 0x38;
  if ((ushort)(undefined2)uVar7 < 0x38) {
    uVar9 = uVar7;
  }
  memcpy(&local_68,args,(ulong)(uVar9 & 0xffff));
  local_68.size = (uint16_t)uVar9;
  iVar17 = *(int *)((long)pvVar3 + 0xa0);
joined_r0x002b62e2:
  do {
    if (pbVar2 <= puVar14) goto LAB_002b652f;
    pUVar4 = args->targetLimit;
    if (pUVar4 <= pUVar20) {
      *err = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_002b652f;
    }
    pUVar5 = args->converter;
    cVar1 = pUVar5->toULength;
    lVar13 = (long)cVar1;
    puVar10 = puVar14;
    if (0 < lVar13) {
      puVar10 = pUVar5->toUBytes;
    }
    if (*puVar10 == 0x1b) {
      lVar11 = 0x35ddf1;
      lVar19 = 0;
      do {
        bVar16 = escSeqCompoundText[lVar19][0];
        lVar15 = 0;
LAB_002b633c:
        if (lVar15 < lVar13) {
          if (pUVar5->toUBytes[lVar15] != bVar16) goto LAB_002b6378;
LAB_002b635f:
          bVar16 = *(byte *)(lVar11 + lVar15);
          lVar15 = lVar15 + 1;
          if (bVar16 == 0) goto LAB_002b638b;
          goto LAB_002b633c;
        }
        if (puVar14 + (lVar15 - lVar13) < pbVar2) {
          if ((int)(char)puVar14[lVar15 - lVar13] != (uint)bVar16) goto LAB_002b6378;
          goto LAB_002b635f;
        }
        *err = U_TRUNCATED_CHAR_FOUND;
LAB_002b6378:
        lVar19 = lVar19 + 1;
        lVar11 = lVar11 + 5;
      } while (lVar19 != 0x14);
      lVar19 = 0xfffffffe;
LAB_002b638b:
      if (*err == U_TRUNCATED_CHAR_FOUND) {
        if (puVar14 < pbVar2) {
          lVar13 = (long)pbVar2 - (long)puVar14;
          do {
            bVar16 = *puVar14;
            puVar14 = puVar14 + 1;
            pUVar5 = args->converter;
            cVar1 = pUVar5->toULength;
            pUVar5->toULength = cVar1 + '\x01';
            pUVar5->toUBytes[cVar1] = bVar16;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
        *err = U_ZERO_ERROR;
        goto LAB_002b652f;
      }
      iVar18 = (int)lVar19;
      if (iVar18 == -2) {
        puVar14 = puVar14 + (cVar1 == '\0');
        *err = U_ILLEGAL_CHAR_FOUND;
        goto LAB_002b652f;
      }
      sVar8 = strlen((char *)(escSeqCompoundText + iVar18));
      puVar14 = puVar14 + ((int)sVar8 - (int)cVar1);
      pUVar5->toULength = '\0';
      iVar17 = iVar18;
    }
    if (iVar17 == 0) {
      if (puVar14 < pbVar2) {
        lVar13 = (long)pbVar2 - (long)puVar14;
        do {
          bVar16 = *puVar14;
          if ((ushort)bVar16 == L'\x1b') break;
          if (pUVar4 <= pUVar20) {
            *err = U_BUFFER_OVERFLOW_ERROR;
            break;
          }
          puVar14 = puVar14 + 1;
          *pUVar20 = (ushort)bVar16;
          pUVar20 = pUVar20 + 1;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      goto joined_r0x002b62e2;
    }
    if (puVar14 < pbVar2) {
      uVar7 = (int)pbVar2 - (int)puVar14;
      if (1 < (int)uVar7) {
        uVar12 = 1;
        do {
          if (puVar14[uVar12] == 0x1b) {
            uVar7 = (uint)uVar12;
            break;
          }
          uVar12 = uVar12 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar12);
      }
      local_68.sourceLimit = (char *)(puVar14 + (int)uVar7);
      pUVar6 = (local_68.converter)->sharedData;
      (local_68.converter)->sharedData = *(UConverterSharedData **)((long)pvVar3 + (long)iVar17 * 8)
      ;
      local_68.source = (char *)puVar14;
      local_68.target = pUVar20;
      ucnv_MBCSToUnicodeWithOffsets_63(&local_68,err);
      pUVar20 = local_68.target;
      puVar14 = (uint8_t *)local_68.source;
      (local_68.converter)->sharedData = pUVar6;
      if (U_ZERO_ERROR < *err) {
        if (*err == U_BUFFER_OVERFLOW_ERROR) {
          if (0 < (long)(local_68.converter)->UCharErrorBufferLength) {
            memcpy(args->converter->UCharErrorBuffer,(local_68.converter)->UCharErrorBuffer,
                   (long)(local_68.converter)->UCharErrorBufferLength);
          }
          args->converter->UCharErrorBufferLength = (local_68.converter)->UCharErrorBufferLength;
          (local_68.converter)->UCharErrorBufferLength = '\0';
        }
LAB_002b652f:
        *(int *)((long)pvVar3 + 0xa0) = iVar17;
        args->target = pUVar20;
        args->source = (char *)puVar14;
        return;
      }
    }
  } while( true );
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_CompoundText_OFFSETS(UConverterToUnicodeArgs *args,
                                               UErrorCode* err){
    const char *mySource = (char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    const char *tmpSourceLimit = mySourceLimit;
    uint32_t mySourceChar = 0x0000;
    COMPOUND_TEXT_CONVERTERS currentState, tmpState;
    int32_t sourceOffset = 0;
    UConverterDataCompoundText *myConverterData = (UConverterDataCompoundText *) args->converter->extraInfo;
    UConverterSharedData* savedSharedData = NULL;

    UConverterToUnicodeArgs subArgs;
    int32_t minArgsSize;

    /* set up the subconverter arguments */
    if(args->size<sizeof(UConverterToUnicodeArgs)) {
        minArgsSize = args->size;
    } else {
        minArgsSize = (int32_t)sizeof(UConverterToUnicodeArgs);
    }

    uprv_memcpy(&subArgs, args, minArgsSize);
    subArgs.size = (uint16_t)minArgsSize;

    currentState = tmpState =  myConverterData->state;

    while(mySource < mySourceLimit){
        if(myTarget < args->targetLimit){
            if (args->converter->toULength > 0) {
                mySourceChar = args->converter->toUBytes[0];
            } else {
                mySourceChar = (uint8_t)*mySource;
            }

            if (mySourceChar == ESC_START) {
                tmpState = findStateFromEscSeq(mySource, mySourceLimit, args->converter->toUBytes, args->converter->toULength, err);

                if (*err == U_TRUNCATED_CHAR_FOUND) {
                    for (; mySource < mySourceLimit;) {
                        args->converter->toUBytes[args->converter->toULength++] = *mySource++;
                    }
                    *err = U_ZERO_ERROR;
                    break;
                } else if (tmpState == INVALID) {
                    if (args->converter->toULength == 0) {
                        mySource++; /* skip over the 0x1b byte */
                    }
                    *err = U_ILLEGAL_CHAR_FOUND;
                    break;
                }

                if (tmpState != currentState) {
                    currentState = tmpState;
                }

                sourceOffset = static_cast<int32_t>(uprv_strlen((char*)escSeqCompoundText[currentState]) - args->converter->toULength);

                mySource += sourceOffset;

                args->converter->toULength = 0;
            }

            if (currentState == COMPOUND_TEXT_SINGLE_0) {
                while (mySource < mySourceLimit) {
                    if (*mySource == ESC_START) {
                        break;
                    }
                    if (myTarget < args->targetLimit) {
                        *myTarget++ = 0x00ff&(*mySource++);
                    } else {
                        *err = U_BUFFER_OVERFLOW_ERROR;
                        break;
                    }
                }
            } else if (mySource < mySourceLimit){
                sourceOffset = findNextEsc(mySource, mySourceLimit);

                tmpSourceLimit = mySource + sourceOffset;

                subArgs.source = mySource;
                subArgs.sourceLimit = tmpSourceLimit;
                subArgs.target = myTarget;
                savedSharedData = subArgs.converter->sharedData;
                subArgs.converter->sharedData = myConverterData->myConverterArray[currentState];

                ucnv_MBCSToUnicodeWithOffsets(&subArgs, err);

                subArgs.converter->sharedData = savedSharedData;

                mySource = subArgs.source;
                myTarget = subArgs.target;

                if (U_FAILURE(*err)) {
                    if(*err == U_BUFFER_OVERFLOW_ERROR) {
                        if(subArgs.converter->UCharErrorBufferLength > 0) {
                            uprv_memcpy(args->converter->UCharErrorBuffer, subArgs.converter->UCharErrorBuffer,
                                        subArgs.converter->UCharErrorBufferLength);
                        }
                        args->converter->UCharErrorBufferLength=subArgs.converter->UCharErrorBufferLength;
                        subArgs.converter->UCharErrorBufferLength = 0;
                    }
                    break;
                }
            }
        } else {
            *err = U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }
    myConverterData->state = currentState;
    args->target = myTarget;
    args->source = mySource;
}